

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::initGenericParams
               (Builder builder,
               Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
               *genericParameters)

{
  ulong uVar1;
  Builder builder_00;
  undefined8 this;
  bool bVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *maybe;
  Located<capnp::Text::Reader> *pLVar5;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  Builder param;
  Located<capnp::Text::Reader> *name;
  Located<capnp::Text::Reader> *_name328;
  Iterator IStack_70;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_long> *__range4;
  Builder params;
  Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>
  *p;
  Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>
  *_p325;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
  *genericParameters_local;
  
  params.builder._32_8_ =
       kj::_::
       readMaybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>>>>>
                 (genericParameters);
  if ((Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>
       *)params.builder._32_8_ !=
      (Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>
       *)0x0) {
    sVar3 = kj::
            Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
            ::size((Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
                    *)params.builder._32_8_);
    Declaration::Builder::initParameters((Builder *)&__range4,&builder,(uint)sVar3);
    ___begin4 = kj::
                indices<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>>>&>
                          ((Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
                            *)params.builder._32_8_);
    __end4 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin4);
    IStack_70 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin4);
    while (bVar2 = kj::Range<unsigned_long>::Iterator::operator==(&__end4,&stack0xffffffffffffff90),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar4 = kj::Range<unsigned_long>::Iterator::operator*(&__end4);
      uVar1 = *puVar4;
      maybe = kj::
              Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
              ::operator[]((Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
                            *)params.builder._32_8_,uVar1 & 0xffffffff);
      pLVar5 = kj::_::
               readMaybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>>
                         (maybe);
      if (pLVar5 != (Located<capnp::Text::Reader> *)0x0) {
        param._builder._32_8_ = pLVar5;
        List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Builder::operator[]
                  ((Builder *)local_b0,(Builder *)&__range4,(uint)uVar1);
        local_c0 = *(undefined8 *)param._builder._32_8_;
        local_b8 = *(undefined8 *)(param._builder._32_8_ + 8);
        Declaration::BrandParameter::Builder::setName
                  ((Builder *)local_b0,(StringPtr)*(StringPtr *)param._builder._32_8_);
        this = param._builder._32_8_;
        memcpy(&local_e8,local_b0,0x28);
        builder_00._builder.capTable = (CapTableBuilder *)uStack_e0;
        builder_00._builder.segment = (SegmentBuilder *)local_e8;
        builder_00._builder.data = (void *)local_d8;
        builder_00._builder.pointers = (WirePointer *)uStack_d0;
        builder_00._builder.dataSize = (undefined4)local_c8;
        builder_00._builder.pointerCount = local_c8._4_2_;
        builder_00._builder._38_2_ = local_c8._6_2_;
        Located<capnp::Text::Reader>::
        copyLocationTo<capnp::compiler::Declaration::BrandParameter::Builder>
                  ((Located<capnp::Text::Reader> *)this,builder_00);
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end4);
    }
  }
  return;
}

Assistant:

static void initGenericParams(Declaration::Builder builder,
    kj::Maybe<Located<kj::Array<kj::Maybe<Located<Text::Reader>>>>>&& genericParameters) {
  KJ_IF_SOME(p, genericParameters) {
    auto params = builder.initParameters(p.value.size());
    for (uint i: kj::indices(p.value)) {
      KJ_IF_SOME(name, p.value[i]) {
        auto param = params[i];
        param.setName(name.value);
        name.copyLocationTo(param);
      }
    }
  }
}